

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.c
# Opt level: O2

mraa_platform_t mraa_x86_platform(void)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  __ssize_t _Var3;
  size_t sVar4;
  char *pcVar5;
  ssize_t sVar6;
  mraa_platform_t mVar7;
  char *pcVar8;
  mraa_boolean_t turbot;
  char *line;
  size_t len;
  char buffer [20];
  
  line = (char *)0x0;
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  len = 0;
  __stream = fopen("/sys/devices/virtual/dmi/id/board_name","r");
  if (__stream == (FILE *)0x0) {
    __stream = fopen("/proc/cmdline","r");
    if (__stream != (FILE *)0x0) {
      _Var3 = getline(&line,&len,__stream);
      pcVar8 = line;
      if (_Var3 != -1) {
        pcVar5 = strstr(line,"sf3gr_mrd_version=P2.0");
        if (pcVar5 == (char *)0x0) {
          mVar7 = MRAA_UNKNOWN_PLATFORM;
        }
        else {
          plat = mraa_intel_sofia_3gr();
          mVar7 = MRAA_INTEL_SOFIA_3GR;
          pcVar8 = line;
        }
        goto LAB_00113d29;
      }
      goto LAB_00113cf2;
    }
    mVar7 = MRAA_UNKNOWN_PLATFORM;
  }
  else {
    _Var3 = getline(&line,&len,__stream);
    pcVar8 = line;
    if (_Var3 == -1) {
LAB_00113cf2:
      mVar7 = MRAA_UNKNOWN_PLATFORM;
    }
    else {
      sVar4 = strcspn(line,"\r\n");
      pcVar5 = line;
      pcVar8[sVar4] = '\0';
      iVar1 = strncmp(line,"GalileoGen2",0xc);
      if ((iVar1 == 0) || (iVar1 = strncmp(pcVar5,"SIMATIC IOT2000",0x10), iVar1 == 0)) {
        plat = mraa_intel_galileo_gen2();
        mVar7 = MRAA_INTEL_GALILEO_GEN2;
        pcVar8 = line;
      }
      else {
        iVar1 = strncmp(pcVar5,"BODEGA BAY",0xb);
        if ((iVar1 == 0) || (iVar1 = strncmp(pcVar5,"SALT BAY",9), iVar1 == 0)) {
          plat = mraa_intel_edison_fab_c();
          mVar7 = MRAA_INTEL_EDISON_FAB_C;
          pcVar8 = line;
        }
        else {
          iVar1 = strncmp(pcVar5,"DE3815",7);
          if (iVar1 == 0) {
            plat = mraa_intel_de3815();
            mVar7 = MRAA_INTEL_DE3815;
            pcVar8 = line;
          }
          else {
            iVar1 = strncmp(pcVar5,"NUC5i5MYBE",0xb);
            if ((iVar1 == 0) || (iVar1 = strncmp(pcVar5,"NUC5i3MYBE",0xb), iVar1 == 0)) {
              plat = mraa_intel_nuc5();
              mVar7 = MRAA_INTEL_NUC5;
              pcVar8 = line;
            }
            else {
              iVar1 = strncmp(pcVar5,"NOTEBOOK",9);
              if ((iVar1 == 0) || (iVar1 = strncasecmp(pcVar5,"MinnowBoard MAX",0x10), iVar1 == 0))
              {
                turbot = 0;
LAB_00113e26:
                plat = mraa_intel_minnowboard_byt_compatible(turbot);
                mVar7 = MRAA_INTEL_MINNOWBOARD_MAX;
                pcVar8 = line;
              }
              else {
                iVar1 = strncasecmp(pcVar5,"Galileo",8);
                if (iVar1 == 0) {
                  mVar7 = MRAA_INTEL_GALILEO_GEN1;
                  plat = mraa_intel_galileo_rev_d();
                  pcVar8 = line;
                }
                else {
                  iVar1 = strncasecmp(pcVar5,"MinnowBoard Compatible",0x17);
                  if ((iVar1 == 0) ||
                     (iVar1 = strncasecmp(pcVar5,"MinnowBoard Turbot",0x13), iVar1 == 0)) {
                    turbot = 1;
                    goto LAB_00113e26;
                  }
                  iVar1 = strncasecmp(pcVar5,"Braswell Cherry Hill",0x15);
                  if (iVar1 == 0) {
                    plat = mraa_intel_cherryhills();
                    mVar7 = MRAA_INTEL_CHERRYHILLS;
                    pcVar8 = line;
                  }
                  else {
                    iVar1 = strncasecmp(pcVar5,"Intel Learning Kit",0x13);
                    if (iVar1 == 0) {
                      plat = mraa_intel_ilk();
                      mVar7 = MRAA_INTEL_ILK;
                      pcVar8 = line;
                    }
                    else {
                      iVar1 = strncasecmp(pcVar5,"UP-CHT01",9);
                      if (iVar1 == 0) {
                        plat = mraa_up_board();
                        mVar7 = MRAA_UP;
                        pcVar8 = line;
                      }
                      else {
                        iVar1 = strncasecmp(pcVar5,"UP-APL01",9);
                        if (iVar1 == 0) {
                          plat = mraa_up2_board();
                          mVar7 = MRAA_UP2;
                          pcVar8 = line;
                        }
                        else {
                          iVar1 = strncasecmp(pcVar5,"RVP",4);
                          if ((iVar1 == 0) || (iVar1 = strncasecmp(pcVar5,"SDS",4), iVar1 == 0)) {
                            plat = mraa_joule_expansion_board();
                            mVar7 = MRAA_INTEL_GT_TUCHUCK;
                            pcVar8 = line;
                          }
                          else {
                            iVar1 = strncasecmp(pcVar5,"SAF3",5);
                            if (iVar1 == 0) {
                              plat = mraa_iei_tank();
                              mVar7 = MRAA_IEI_TANK;
                              pcVar8 = line;
                            }
                            else {
                              mVar7 = MRAA_ADLINK_LEC_AL;
                              iVar1 = strncasecmp(pcVar5,"LEC-ALAI",9);
                              if ((iVar1 == 0) ||
                                 (iVar1 = strncasecmp(pcVar5,"LEC-AL",7), iVar1 == 0)) {
                                plat = mraa_lec_al_board();
                                pcVar8 = line;
                              }
                              else {
                                iVar1 = strncasecmp(pcVar5,"UP-WHL01",9);
                                if (iVar1 == 0) {
                                  plat = mraa_upxtreme_board();
                                  mVar7 = MRAA_UPXTREME;
                                  pcVar8 = line;
                                }
                                else {
                                  syslog(3,"Platform not supported, not initialising");
                                  mVar7 = MRAA_UNKNOWN_PLATFORM;
                                  pcVar8 = line;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00113d29:
      free(pcVar8);
    }
    fclose(__stream);
  }
  iVar1 = open("/sys/devices/virtual/dmi/id/product_name",0);
  if (iVar1 == -1) {
    return mVar7;
  }
  syslog(3,"Checking additional Platform support for LEC-AL iPI");
  sVar6 = read(iVar1,buffer,10);
  if (sVar6 < 1) {
    return mVar7;
  }
  iVar2 = strncasecmp(buffer,"LEC-AL-AI",9);
  if (iVar2 == 0) {
    mVar7 = MRAA_ADLINK_LEC_AL_AI;
    pcVar8 = "LEC-AL AI IPi found. starting MRAA";
  }
  else {
    iVar2 = strncasecmp(buffer,"LEC-AL",6);
    if (iVar2 != 0) goto LAB_00113dda;
    mVar7 = MRAA_ADLINK_LEC_AL;
    pcVar8 = "LEC-AL IPi found. starting MRAA";
  }
  syslog(3,pcVar8);
  plat = mraa_lec_al_board();
LAB_00113dda:
  close(iVar1);
  return mVar7;
}

Assistant:

mraa_platform_t
mraa_x86_platform()
{
#ifndef MRAA_PLATFORM_FORCE
    mraa_platform_t platform_type = MRAA_UNKNOWN_PLATFORM;

    char* line = NULL, buffer[20] = {0};
    // let getline allocate memory for *line
    size_t len = 0;
    FILE* fh = fopen("/sys/devices/virtual/dmi/id/board_name", "r");
    int fd;

    if (fh != NULL) {
        if (getline(&line, &len, fh) != -1) {
            // Sanitize input by terminating at any of possible end of line chars
            line[strcspn(line, "\r\n")] = 0;

            if (strncmp(line, "GalileoGen2", strlen("GalileoGen2") + 1) == 0 ||
                strncmp(line, "SIMATIC IOT2000", strlen("SIMATIC IOT2000") + 1) == 0) {
                platform_type = MRAA_INTEL_GALILEO_GEN2;
                plat = mraa_intel_galileo_gen2();
            } else if (strncmp(line, "BODEGA BAY", strlen("BODEGA BAY") + 1) == 0) {
                platform_type = MRAA_INTEL_EDISON_FAB_C;
                plat = mraa_intel_edison_fab_c();
            } else if (strncmp(line, "SALT BAY", strlen("SALT BAY") + 1) == 0) {
                platform_type = MRAA_INTEL_EDISON_FAB_C;
                plat = mraa_intel_edison_fab_c();
            } else if (strncmp(line, "DE3815", strlen("DE3815") + 1) == 0) {
                platform_type = MRAA_INTEL_DE3815;
                plat = mraa_intel_de3815();
            } else if (strncmp(line, "NUC5i5MYBE", strlen("NUC5i5MYBE") + 1) == 0 ||
                       strncmp(line, "NUC5i3MYBE", strlen("NUC5i3MYBE") + 1) == 0) {
                platform_type = MRAA_INTEL_NUC5;
                plat = mraa_intel_nuc5();
            } else if (strncmp(line, "NOTEBOOK", strlen("NOTEBOOK") + 1) == 0) {
                platform_type = MRAA_INTEL_MINNOWBOARD_MAX;
                plat = mraa_intel_minnowboard_byt_compatible(0);
            } else if (strncasecmp(line, "MinnowBoard MAX", strlen("MinnowBoard MAX") + 1) == 0) {
                platform_type = MRAA_INTEL_MINNOWBOARD_MAX;
                plat = mraa_intel_minnowboard_byt_compatible(0);
            } else if (strncasecmp(line, "Galileo", strlen("Galileo") + 1) == 0) {
                platform_type = MRAA_INTEL_GALILEO_GEN1;
                plat = mraa_intel_galileo_rev_d();
            } else if (strncasecmp(line, "MinnowBoard Compatible", strlen("MinnowBoard Compatible") + 1) == 0) {
                platform_type = MRAA_INTEL_MINNOWBOARD_MAX;
                plat = mraa_intel_minnowboard_byt_compatible(1);
            } else if (strncasecmp(line, "MinnowBoard Turbot", strlen("MinnowBoard Turbot") + 1) == 0) {
                platform_type = MRAA_INTEL_MINNOWBOARD_MAX;
                plat = mraa_intel_minnowboard_byt_compatible(1);
            } else if (strncasecmp(line, "Braswell Cherry Hill", strlen("Braswell Cherry Hill") + 1) == 0) {
                platform_type = MRAA_INTEL_CHERRYHILLS;
                plat = mraa_intel_cherryhills();
            } else if (strncasecmp(line, "Intel Learning Kit", strlen("Intel Learning Kit") + 1) == 0) {
                platform_type = MRAA_INTEL_ILK;
                plat = mraa_intel_ilk();
            } else if (strncasecmp(line, "UP-CHT01", strlen("UP-CHT01") + 1) == 0) {
                platform_type = MRAA_UP;
                plat = mraa_up_board();
            } else if (strncasecmp(line, "UP-APL01", strlen("UP-APL01") + 1) == 0) {
                platform_type = MRAA_UP2;
                plat = mraa_up2_board();
            } else if (strncasecmp(line, "RVP", strlen("RVP") + 1) == 0) {
                platform_type = MRAA_INTEL_JOULE_EXPANSION;
                plat = mraa_joule_expansion_board();
            } else if (strncasecmp(line, "SDS", strlen("SDS") + 1) == 0) {
                platform_type = MRAA_INTEL_JOULE_EXPANSION;
                plat = mraa_joule_expansion_board();
            } else if ((strncasecmp(line, "SAF3", strlen("SAF3") + 1) == 0) ) {
                platform_type = MRAA_IEI_TANK;
                plat = mraa_iei_tank();
            } else if ((strncasecmp(line, "LEC-ALAI", strlen("LEC-ALAI") + 1) == 0) ) {
                platform_type = MRAA_ADLINK_LEC_AL;
                plat = mraa_lec_al_board();
	    } else if ((strncasecmp(line, "LEC-AL", strlen("LEC-AL") + 1) == 0) ) {
                platform_type = MRAA_ADLINK_LEC_AL;
                plat = mraa_lec_al_board();
            } else if (strncasecmp(line, "UP-WHL01", strlen("UP-WHL01") + 1) == 0) {
                platform_type = MRAA_UPXTREME;
                plat = mraa_upxtreme_board();
            } else {
                syslog(LOG_ERR, "Platform not supported, not initialising");
                platform_type = MRAA_UNKNOWN_PLATFORM;
            }
            free(line);
        }
        fclose(fh);
    } else {
        fh = fopen("/proc/cmdline", "r");
        if (fh != NULL) {
            if (getline(&line, &len, fh) != -1) {
                if (strstr(line, "sf3gr_mrd_version=P2.0")) {
                    platform_type = MRAA_INTEL_SOFIA_3GR;
                    plat = mraa_intel_sofia_3gr();
                }
                free(line);
            }
            fclose(fh);
        }
    }

    if( (fd = open("/sys/devices/virtual/dmi/id/product_name", O_RDONLY)) != -1) {
	    syslog(LOG_ERR, "Checking additional Platform support for LEC-AL iPI");
	    if(read(fd, buffer, 10) > 0) {
		    if ((strncasecmp(buffer, "LEC-AL-AI", strlen("LEC-AL-AI")) == 0)) {
			    syslog(LOG_ERR, "LEC-AL AI IPi found. starting MRAA");
			    platform_type = MRAA_ADLINK_LEC_AL_AI;
			    plat = mraa_lec_al_board();
		    }
		    else if ((strncasecmp(buffer, "LEC-AL", strlen("LEC-AL")) == 0)) {
			    syslog(LOG_ERR, "LEC-AL IPi found. starting MRAA");
			    platform_type = MRAA_ADLINK_LEC_AL;
			    plat = mraa_lec_al_board();
		    }
		    close(fd);
	    }
    }

    return platform_type;
#else
    #if defined(xMRAA_INTEL_GALILEO_GEN2)
    plat = mraa_intel_galileo_gen2();
    #elif defined(xMRAA_INTEL_EDISON_FAB_C)
    plat = mraa_intel_edison_fab_c();
    #elif defined(xMRAA_INTEL_DE3815)
    plat = mraa_intel_de3815();
    #elif defined(xMRAA_INTEL_MINNOWBOARD_MAX)
    plat = mraa_intel_minnowboard_byt_compatible();
    #elif defined(xMRAA_INTEL_GALILEO_GEN1)
    plat = mraa_intel_galileo_rev_d();
    #elif defined(xMRAA_INTEL_NUC5)
    plat = mraa_intel_nuc5();
    #elif defined(xMRAA_INTEL_SOFIA_3GR)
    plat = mraa_intel_sofia_3gr();
    #elif defined(xMRAA_INTEL_CHERRYHILLS)
    plat = mraa_intel_cherryhills();
    #elif defined(xMRAA_UP)
    plat = mraa_up_board();
    #elif defined(xMRAA_UP2)
    plat = mraa_up2_board();
    #elif defined(xMRAA_INTEL_JOULE_EXPANSION)
    plat = mraa_joule_expansion_board();
    #elif defined(xMRAA_IEI_TANK)
    plat = mraa_iei_tank();
    #elif defined(xMRAA_UPXTREME)
    plat = mraa_upxtreme_board();
    #else
        #error "Not using a valid platform value from mraa_platform_t - cannot compile"
    #endif
    return MRAA_PLATFORM_FORCE;
#endif
}